

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_radix_tree.hpp
# Opt level: O1

int __thiscall
cinatra::radix_tree::insert
          (radix_tree *this,string *path,
          function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *handler,
          string *method)

{
  char cVar1;
  char cVar2;
  element_type *peVar3;
  pointer pcVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  int iVar12;
  uint start;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type __pos;
  undefined4 uVar13;
  size_type __pos_00;
  uint start_00;
  bool bVar14;
  shared_ptr<cinatra::radix_tree_node> child_1;
  shared_ptr<cinatra::radix_tree_node> child;
  undefined1 local_1c9;
  element_type *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  undefined1 local_1b8 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  size_type sStack_150;
  undefined4 local_144;
  undefined8 local_140;
  _Any_data local_138;
  radix_tree_node *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  _Alloc_hider local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_108 [16];
  radix_tree_node *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  _Alloc_hider local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  undefined1 local_d8 [24];
  code *local_c0;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> local_70;
  _Any_data local_50;
  code *local_40;
  
  local_1c8 = (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  _Stack_1c0._M_pi =
       (this->root).super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (_Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_1c0._M_pi)->_M_use_count = (_Stack_1c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_1c0._M_pi)->_M_use_count = (_Stack_1c0._M_pi)->_M_use_count + 1;
    }
  }
  local_1b8._32_8_ = path->_M_string_length;
  local_d8._0_8_ = SEXT48((int)local_1b8._32_8_);
  local_1b8._24_8_ = 0;
  uVar13 = 0;
  start_00 = 0;
  local_1b8._40_8_ = path;
  local_140 = method;
  local_138._M_unused._M_object = handler;
  local_138._8_8_ = this;
  do {
    uVar9 = local_1b8._40_8_;
    if ((int)local_1b8._32_4_ <= (int)start_00) break;
    __pos_00 = (size_type)(int)start_00;
    if ((local_1c8->indices)._M_string_length == 0) {
LAB_001b1d96:
      bVar14 = false;
LAB_001b1d99:
      bVar7 = bVar14;
      bVar14 = false;
    }
    else {
      cVar1 = *(local_1c8->indices)._M_dataplus._M_p;
      bVar14 = true;
      if (((cVar1 == '*') ||
          (cVar2 = ((_Alloc_hider *)local_1b8._40_8_)->_M_p[__pos_00], cVar2 == '*')) ||
         ((cVar1 == ':' && (cVar2 != ':')))) {
        bVar7 = false;
      }
      else {
        bVar14 = cVar1 != ':' && cVar2 == ':';
        bVar7 = false;
        if ((cVar2 == ':') && (cVar1 == ':' || cVar2 != ':')) {
          if (cVar1 != ':') goto LAB_001b1d96;
          iVar12 = find_pos((radix_tree *)local_138._8_8_,(string *)local_1b8._40_8_,'/',start_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar9,
                     (long)(int)(start_00 + 1),(long)(int)(~start_00 + iVar12));
          peVar3 = (((local_1c8->children).
                     super__Vector_base<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<cinatra::radix_tree_node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          bVar7 = true;
          if ((pointer)local_90._M_string_length == *(pointer *)((long)&peVar3->path + 8)) {
            bVar14 = true;
            if ((pointer)local_90._M_string_length == (pointer)0x0) goto LAB_001b1d99;
            iVar12 = bcmp(local_90._M_dataplus._M_p,*(void **)&peVar3->path,
                          local_90._M_string_length);
            bVar14 = iVar12 != 0;
          }
          else {
            bVar14 = true;
          }
        }
      }
    }
    if ((bVar7) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2)) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar14) {
      local_1b8._24_8_ = 0xffffffff;
      break;
    }
    radix_tree_node::get_child((radix_tree_node *)&local_e8,(char)local_1c8);
    uVar10 = local_138._8_8_;
    uVar9 = local_1b8._40_8_;
    if ((radix_tree_node *)local_e8._M_p == (radix_tree_node *)0x0) {
      local_144 = uVar13;
      start = find_pos((radix_tree *)local_138._8_8_,(string *)local_1b8._40_8_,':',start_00);
      peVar3 = local_1c8;
      if (start == local_1b8._32_4_) {
        iVar12 = find_pos((radix_tree *)uVar10,(string *)uVar9,'*',start_00);
        peVar3 = local_1c8;
        cVar1 = ((_Alloc_hider *)uVar9)->_M_p[__pos_00];
        local_1b8._24_4_ = iVar12;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b8 + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar9,
                   __pos_00,(long)(int)(iVar12 - start_00));
        local_f8 = (radix_tree_node *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                  (&local_f0,&local_f8,(allocator<cinatra::radix_tree_node> *)&local_1c9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b8 + 0x30));
        radix_tree_node::insert_child
                  ((radix_tree_node *)local_1b8,(char)peVar3,
                   (shared_ptr<cinatra::radix_tree_node> *)(ulong)(uint)(int)cVar1);
        uVar13 = local_144;
        uVar9 = local_1b8._8_8_;
        local_1c8 = (element_type *)local_1b8._0_8_;
        _Var8._M_pi = _Stack_1c0._M_pi;
        local_1b8._0_8_ = (radix_tree_node *)0x0;
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
        if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
        }
        if ((radix_tree_node *)local_1b8._48_8_ != (radix_tree_node *)(local_1b8 + 0x40)) {
          operator_delete((void *)local_1b8._48_8_,CONCAT71(local_1b8._65_7_,local_1b8[0x40]) + 1);
        }
        peVar3 = local_1c8;
        if ((int)local_1b8._24_4_ < (int)local_1b8._32_4_) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b8 + 0x30),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1b8._40_8_,(long)(local_1b8._24_4_ + 1),0xffffffffffffffff);
          local_108._0_8_ = 0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                     (radix_tree_node **)local_108,(allocator<cinatra::radix_tree_node> *)&local_1c9
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_1b8 + 0x30));
          radix_tree_node::insert_child
                    ((radix_tree_node *)local_1b8,(char)peVar3,
                     (shared_ptr<cinatra::radix_tree_node> *)0x2a);
          uVar9 = local_1b8._8_8_;
          local_1c8 = (element_type *)local_1b8._0_8_;
          _Var8._M_pi = _Stack_1c0._M_pi;
          local_1b8._0_8_ = (radix_tree_node *)0x0;
          local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
          if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          if ((radix_tree_node *)local_1b8._48_8_ != (radix_tree_node *)(local_1b8 + 0x40)) {
            operator_delete((void *)local_1b8._48_8_,CONCAT71(local_1b8._65_7_,local_1b8[0x40]) + 1)
            ;
          }
          uVar13 = uVar13 + 1;
        }
        peVar3 = local_1c8;
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
                  (&local_b0,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_138._M_unused._0_8_);
        iVar12 = radix_tree_node::add_handler(peVar3,&local_b0,(string *)local_140);
        local_1b8._24_8_ = CONCAT44(extraout_var_00,iVar12);
        if (local_b0.super__Function_base._M_manager != (code *)0x0) {
          (*local_b0.super__Function_base._M_manager)(&local_b0,&local_b0,3);
        }
LAB_001b23f6:
        iVar12 = 3;
        bVar14 = false;
      }
      else {
        cVar1 = ((_Alloc_hider *)uVar9)->_M_p[__pos_00];
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b8 + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar9,
                   __pos_00,(long)(int)(start - start_00));
        local_118._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                  (&local_110,(radix_tree_node **)&local_118,
                   (allocator<cinatra::radix_tree_node> *)&local_1c9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b8 + 0x30));
        uVar10 = local_138._8_8_;
        radix_tree_node::insert_child
                  ((radix_tree_node *)local_1b8,(char)peVar3,
                   (shared_ptr<cinatra::radix_tree_node> *)(ulong)(uint)(int)cVar1);
        uVar13 = local_144;
        uVar9 = local_1b8._8_8_;
        local_1c8 = (element_type *)local_1b8._0_8_;
        _Var8._M_pi = _Stack_1c0._M_pi;
        local_1b8._0_8_ = (radix_tree_node *)0x0;
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
        if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
        }
        if ((radix_tree_node *)local_1b8._48_8_ != (radix_tree_node *)(local_1b8 + 0x40)) {
          operator_delete((void *)local_1b8._48_8_,CONCAT71(local_1b8._65_7_,local_1b8[0x40]) + 1);
        }
        uVar9 = local_1b8._40_8_;
        start_00 = find_pos((radix_tree *)uVar10,(string *)local_1b8._40_8_,'/',start);
        peVar3 = local_1c8;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b8 + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar9,
                   (long)(int)(start + 1),(long)(int)(~start + start_00));
        local_128 = (radix_tree_node *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                  (&local_120,&local_128,(allocator<cinatra::radix_tree_node> *)&local_1c9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_1b8 + 0x30));
        radix_tree_node::insert_child
                  ((radix_tree_node *)local_1b8,(char)peVar3,
                   (shared_ptr<cinatra::radix_tree_node> *)0x3a);
        uVar9 = local_1b8._8_8_;
        local_1c8 = (element_type *)local_1b8._0_8_;
        _Var8._M_pi = _Stack_1c0._M_pi;
        local_1b8._0_8_ = (radix_tree_node *)0x0;
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
        if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
        }
        if ((radix_tree_node *)local_1b8._48_8_ != (radix_tree_node *)(local_1b8 + 0x40)) {
          operator_delete((void *)local_1b8._48_8_,CONCAT71(local_1b8._65_7_,local_1b8[0x40]) + 1);
        }
        peVar3 = local_1c8;
        uVar13 = uVar13 + 1;
        if (start_00 == local_1b8._32_4_) {
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   (local_d8 + 8),
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_138._M_unused._0_8_);
          iVar12 = radix_tree_node::add_handler
                             (peVar3,(function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                      *)(local_d8 + 8),(string *)local_140);
          local_1b8._24_8_ = CONCAT44(extraout_var_02,iVar12);
          if (local_c0 != (code *)0x0) {
            (*local_c0)(local_d8 + 8,local_d8 + 8,3);
          }
          goto LAB_001b23f6;
        }
        iVar12 = 0;
        bVar14 = true;
      }
      if (bVar14) {
LAB_001b2402:
        iVar12 = 0;
      }
    }
    else {
      local_1c8 = (element_type *)local_e8._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_1c0,&local_e0);
      peVar3 = local_1c8;
      pcVar4 = ((_Alloc_hider *)local_1b8._40_8_)->_M_p;
      if (pcVar4[__pos_00] == ':') {
        uVar13 = uVar13 + 1;
        start_00 = start_00 + (int)(local_1c8->path)._M_string_length + 1;
        if (start_00 != local_1b8._32_4_) goto LAB_001b2402;
        std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
                  ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   &local_50,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_138._M_unused._0_8_);
        iVar12 = radix_tree_node::add_handler
                           (peVar3,(function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                                    *)&local_50,(string *)local_140);
        local_1b8._24_8_ = CONCAT44(extraout_var,iVar12);
        iVar12 = 3;
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
      }
      else {
        uVar5 = (local_1c8->path)._M_string_length;
        bVar14 = uVar5 != 0;
        if (((int)start_00 < (int)local_1b8._32_4_ && bVar14) &&
           (pcVar6 = (local_1c8->path)._M_dataplus._M_p, pcVar4[__pos_00] == *pcVar6)) {
          uVar11 = 1;
          do {
            __pos = uVar11;
            bVar14 = __pos < uVar5;
            if (((long)local_d8._0_8_ <= (long)(__pos + __pos_00)) || (uVar5 <= __pos)) {
              start_00 = start_00 + (int)__pos;
              goto LAB_001b215f;
            }
            uVar11 = __pos + 1;
          } while (pcVar4[__pos + __pos_00] == pcVar6[__pos]);
          start_00 = (start_00 + (int)(__pos + 1)) - 1;
        }
        else {
          __pos = 0;
        }
LAB_001b215f:
        if (bVar14) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b8 + 0x30),&local_1c8->path,__pos,0xffffffffffffffff);
          local_1b8._0_8_ = (radix_tree_node *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<cinatra::radix_tree_node,std::allocator<cinatra::radix_tree_node>,std::__cxx11::string>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),
                     (radix_tree_node **)local_1b8,(allocator<cinatra::radix_tree_node> *)&local_1c9
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_1b8 + 0x30));
          if ((radix_tree_node *)local_1b8._48_8_ != (radix_tree_node *)(local_1b8 + 0x40)) {
            operator_delete((void *)local_1b8._48_8_,CONCAT71(local_1b8._65_7_,local_1b8[0x40]) + 1)
            ;
          }
          uVar9 = local_1b8._0_8_;
          peVar3 = local_1c8;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b8._0_8_ + 0x20),&(local_1c8->handler).method);
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          operator=((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                    (uVar9 + 0x40),&(peVar3->handler).handler);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b8._0_8_ + 0xa0),&local_1c8->indices);
          std::
          vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
          ::operator=((vector<std::shared_ptr<cinatra::radix_tree_node>,_std::allocator<std::shared_ptr<cinatra::radix_tree_node>_>_>
                       *)(local_1b8._0_8_ + 0xc0),&local_1c8->children);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b8 + 0x30),&local_1c8->path,0,__pos);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_1c8->path,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b8 + 0x30));
          if ((radix_tree_node *)local_1b8._48_8_ != (radix_tree_node *)(local_1b8 + 0x40)) {
            operator_delete((void *)local_1b8._48_8_,CONCAT71(local_1b8._65_7_,local_1b8[0x40]) + 1)
            ;
          }
          peVar3 = local_1c8;
          local_1b8._48_8_ = local_1b8 + 0x40;
          local_1b8._56_8_ = 0;
          local_1b8[0x40] = '\0';
          local_158._M_p = (pointer)0x0;
          sStack_150 = 0;
          local_168._M_allocated_capacity = 0;
          local_168._8_8_ = (_Invoker_type)0x0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&(local_1c8->handler).method,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1b8 + 0x30));
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          operator=(&(peVar3->handler).handler,
                    (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                    &local_168);
          if ((code *)local_158._M_p != (code *)0x0) {
            (*(code *)local_158._M_p)(&local_168,&local_168,3);
          }
          if ((undefined1 *)local_1b8._48_8_ != local_1b8 + 0x40) {
            operator_delete((void *)local_1b8._48_8_,CONCAT71(local_1b8._65_7_,local_1b8[0x40]) + 1)
            ;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace_aux(&local_1c8->indices,0,(local_1c8->indices)._M_string_length,1,
                         **(char **)local_1b8._0_8_);
          local_1b8._48_8_ = local_1b8._0_8_;
          local_1b8._56_8_ = local_1b8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_1b8._8_8_ + 8) = *(_Atomic_word *)(local_1b8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_1b8._8_8_ + 8) = *(_Atomic_word *)(local_1b8._8_8_ + 8) + 1;
            }
          }
          std::
          vector<std::shared_ptr<cinatra::radix_tree_node>,std::allocator<std::shared_ptr<cinatra::radix_tree_node>>>
          ::_M_assign_aux<std::shared_ptr<cinatra::radix_tree_node>const*>
                    ((vector<std::shared_ptr<cinatra::radix_tree_node>,std::allocator<std::shared_ptr<cinatra::radix_tree_node>>>
                      *)&local_1c8->children,local_1b8 + 0x30,local_1b8 + 0x40);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._56_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._56_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
        }
        peVar3 = local_1c8;
        iVar12 = 0;
        if (start_00 == local_1b8._32_4_) {
          std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::
          function(&local_70,
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   local_138._M_unused._0_8_);
          iVar12 = radix_tree_node::add_handler(peVar3,&local_70,(string *)local_140);
          local_1b8._24_8_ = CONCAT44(extraout_var_01,iVar12);
          iVar12 = 3;
          if (local_70.super__Function_base._M_manager != (code *)0x0) {
            (*local_70.super__Function_base._M_manager)(&local_70,&local_70,3);
          }
        }
        if (start_00 != local_1b8._32_4_) goto LAB_001b2402;
      }
    }
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
    }
  } while (iVar12 == 0);
  if (*(int *)(*(long *)local_138._8_8_ + 0xd8) < (int)uVar13) {
    *(undefined4 *)(*(long *)local_138._8_8_ + 0xd8) = uVar13;
  }
  if (_Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
  }
  return (int)local_1b8._24_8_;
}

Assistant:

int insert(
      const std::string &path,
      std::function<void(coro_http_request &req, coro_http_response &resp)>
          handler,
      const std::string &method) {
    auto root = this->root;
    int i = 0, n = path.size(), param_count = 0, code = 0;
    while (i < n) {
      if (!root->indices.empty() &&
          (root->indices[0] == type_asterisk || path[i] == type_asterisk ||
           (path[i] != type_colon && root->indices[0] == type_colon) ||
           (path[i] == type_colon && root->indices[0] != type_colon) ||
           (path[i] == type_colon && root->indices[0] == type_colon &&
            path.substr(i + 1, find_pos(path, type_slash, i) - i - 1) !=
                root->children[0]->path))) {
        code = -1;
        break;
      }

      auto child = root->get_child(path[i]);
      if (!child) {
        auto p = find_pos(path, type_colon, i);

        if (p == n) {
          p = find_pos(path, type_asterisk, i);

          root = root->insert_child(path[i], std::make_shared<radix_tree_node>(
                                                 path.substr(i, p - i)));

          if (p < n) {
            root = root->insert_child(
                type_asterisk,
                std::make_shared<radix_tree_node>(path.substr(p + 1)));
            ++param_count;
          }

          code = root->add_handler(handler, method);
          break;
        }

        root = root->insert_child(
            path[i], std::make_shared<radix_tree_node>(path.substr(i, p - i)));

        i = find_pos(path, type_slash, p);

        root = root->insert_child(
            type_colon,
            std::make_shared<radix_tree_node>(path.substr(p + 1, i - p - 1)));
        ++param_count;

        if (i == n) {
          code = root->add_handler(handler, method);
          break;
        }
      }
      else {
        root = child;

        if (path[i] == type_colon) {
          ++param_count;
          i += root->path.size() + 1;

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
        else {
          auto j = 0UL;
          auto m = root->path.size();

          for (; i < n && j < m && path[i] == root->path[j]; ++i, ++j) {
          }

          if (j < m) {
            std::shared_ptr<radix_tree_node> child(
                std::make_shared<radix_tree_node>(root->path.substr(j)));
            child->handler = root->handler;
            child->indices = root->indices;
            child->children = root->children;

            root->path = root->path.substr(0, j);
            root->handler = {};
            root->indices = child->path[0];
            root->children = {child};
          }

          if (i == n) {
            code = root->add_handler(handler, method);
            break;
          }
        }
      }
    }

    if (param_count > this->root->max_params)
      this->root->max_params = param_count;

    return code;
  }